

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

value_type *
phmap::priv::NodeHashMapPolicy<int,int>::
new_element<phmap::priv::Alloc<std::pair<int_const,int>>,std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<>>
          (Alloc<std::pair<const_int,_int>_> *alloc,piecewise_construct_t *args,
          tuple<const_int_&> *args_1,tuple<> *args_2)

{
  pointer p;
  value_type *res;
  PairAlloc pair_alloc;
  tuple<> *args_local_2;
  tuple<const_int_&> *args_local_1;
  piecewise_construct_t *args_local;
  Alloc<std::pair<const_int,_int>_> *alloc_local;
  
  pair_alloc.id_ = (size_t)args_2;
  Alloc<std::pair<const_int,_int>_>::Alloc((Alloc<std::pair<const_int,_int>_> *)&res,alloc);
  p = allocator_traits<phmap::priv::Alloc<std::pair<const_int,_int>_>_>::allocate
                ((Alloc<std::pair<const_int,_int>_> *)&res,1);
  allocator_traits<phmap::priv::Alloc<std::pair<int_const,int>>>::
  construct<std::pair<int_const,int>,std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<>>
            ((Alloc<std::pair<const_int,_int>_> *)&res,p,args,args_1,(tuple<> *)pair_alloc.id_);
  Alloc<std::pair<const_int,_int>_>::~Alloc((Alloc<std::pair<const_int,_int>_> *)&res);
  return p;
}

Assistant:

static value_type* new_element(Allocator* alloc, Args&&... args) {
        using PairAlloc = typename phmap::allocator_traits<
            Allocator>::template rebind_alloc<value_type>;
        PairAlloc pair_alloc(*alloc);
        value_type* res =
            phmap::allocator_traits<PairAlloc>::allocate(pair_alloc, 1);
        phmap::allocator_traits<PairAlloc>::construct(pair_alloc, res,
                                                      std::forward<Args>(args)...);
        return res;
    }